

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  Ref<embree::Geometry> *pRVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 (*pauVar40) [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  byte bVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 (*pauVar59) [16];
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 bi_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  uint uVar80;
  undefined1 auVar74 [16];
  uint uVar81;
  uint uVar82;
  uint uVar83;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  uint uVar84;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar85;
  float fVar86;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  vint4 bi;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar94;
  undefined1 auVar89 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  vint4 ai;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar109;
  float fVar110;
  float fVar113;
  float fVar115;
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar124;
  undefined1 auVar111 [32];
  float fVar114;
  float fVar116;
  float fVar118;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar125;
  float fVar126;
  undefined1 auVar112 [32];
  float fVar127;
  float fVar131;
  float fVar132;
  undefined1 auVar128 [16];
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar129 [32];
  float fVar133;
  undefined1 auVar130 [32];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [32];
  undefined1 auVar153 [32];
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1460 [8];
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [8];
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  undefined4 uStack_1344;
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined4 local_1260;
  undefined4 uStack_125c;
  undefined4 uStack_1258;
  undefined4 uStack_1254;
  undefined4 uStack_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  undefined4 local_1240;
  undefined4 uStack_123c;
  undefined4 uStack_1238;
  undefined4 uStack_1234;
  undefined4 uStack_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  float local_fe0 [4];
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined4 uStack_fc4;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar59 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar63._4_4_ = uVar2;
  auVar63._0_4_ = uVar2;
  auVar63._8_4_ = uVar2;
  auVar63._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar64._4_4_ = uVar2;
  auVar64._0_4_ = uVar2;
  auVar64._8_4_ = uVar2;
  auVar64._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar56 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar50 = (tray->tfar).field_0.i[k];
  auVar73 = ZEXT1664(CONCAT412(iVar50,CONCAT48(iVar50,CONCAT44(iVar50,iVar50))));
  iVar50 = (tray->tnear).field_0.i[k];
  auVar66._4_4_ = iVar50;
  auVar66._0_4_ = iVar50;
  auVar66._8_4_ = iVar50;
  auVar66._12_4_ = iVar50;
  local_1340._16_16_ = mm_lookupmask_ps._240_16_;
  local_1340._0_16_ = mm_lookupmask_ps._0_16_;
  auVar106._8_4_ = 0x3f800000;
  auVar106._0_8_ = 0x3f8000003f800000;
  auVar106._12_4_ = 0x3f800000;
  auVar106._16_4_ = 0x3f800000;
  auVar106._20_4_ = 0x3f800000;
  auVar106._24_4_ = 0x3f800000;
  auVar106._28_4_ = 0x3f800000;
  auVar75._8_4_ = 0xbf800000;
  auVar75._0_8_ = 0xbf800000bf800000;
  auVar75._12_4_ = 0xbf800000;
  auVar75._16_4_ = 0xbf800000;
  auVar75._20_4_ = 0xbf800000;
  auVar75._24_4_ = 0xbf800000;
  auVar75._28_4_ = 0xbf800000;
  _local_1360 = vblendvps_avx(auVar106,auVar75,local_1340);
LAB_0032ac92:
  do {
    pauVar40 = pauVar59 + -1;
    pauVar59 = pauVar59 + -1;
    if (*(float *)(*pauVar40 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar62 = *(ulong *)*pauVar59;
      while ((uVar62 & 8) == 0) {
        auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar56),auVar63);
        auVar105._0_4_ = auVar67._0_4_ * fVar3;
        auVar105._4_4_ = auVar67._4_4_ * fVar3;
        auVar105._8_4_ = auVar67._8_4_ * fVar3;
        auVar105._12_4_ = auVar67._12_4_ * fVar3;
        auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar57),auVar64);
        auVar74._0_4_ = auVar67._0_4_ * fVar4;
        auVar74._4_4_ = auVar67._4_4_ * fVar4;
        auVar74._8_4_ = auVar67._8_4_ * fVar4;
        auVar74._12_4_ = auVar67._12_4_ * fVar4;
        auVar67 = vpmaxsd_avx(auVar105,auVar74);
        auVar105 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + uVar58),auVar65);
        auVar89._0_4_ = auVar105._0_4_ * fVar5;
        auVar89._4_4_ = auVar105._4_4_ * fVar5;
        auVar89._8_4_ = auVar105._8_4_ * fVar5;
        auVar89._12_4_ = auVar105._12_4_ * fVar5;
        auVar105 = vpmaxsd_avx(auVar89,auVar66);
        auVar105 = vpmaxsd_avx(auVar67,auVar105);
        auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + (uVar56 ^ 0x10)),auVar63);
        auVar87._0_4_ = auVar67._0_4_ * fVar3;
        auVar87._4_4_ = auVar67._4_4_ * fVar3;
        auVar87._8_4_ = auVar67._8_4_ * fVar3;
        auVar87._12_4_ = auVar67._12_4_ * fVar3;
        auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + (uVar57 ^ 0x10)),auVar64);
        auVar102._0_4_ = auVar67._0_4_ * fVar4;
        auVar102._4_4_ = auVar67._4_4_ * fVar4;
        auVar102._8_4_ = auVar67._8_4_ * fVar4;
        auVar102._12_4_ = auVar67._12_4_ * fVar4;
        auVar67 = vpminsd_avx(auVar87,auVar102);
        auVar74 = vsubps_avx(*(undefined1 (*) [16])(uVar62 + 0x20 + (uVar58 ^ 0x10)),auVar65);
        auVar103._0_4_ = auVar74._0_4_ * fVar5;
        auVar103._4_4_ = auVar74._4_4_ * fVar5;
        auVar103._8_4_ = auVar74._8_4_ * fVar5;
        auVar103._12_4_ = auVar74._12_4_ * fVar5;
        auVar74 = vpminsd_avx(auVar103,auVar73._0_16_);
        auVar67 = vpminsd_avx(auVar67,auVar74);
        auVar67 = vpcmpgtd_avx(auVar105,auVar67);
        iVar50 = vmovmskps_avx(auVar67);
        local_1180._0_16_ = auVar105;
        if (iVar50 == 0xf) {
          if (pauVar59 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0032ac92;
        }
        bVar49 = (byte)iVar50 ^ 0xf;
        uVar60 = uVar62 & 0xfffffffffffffff0;
        lVar61 = 0;
        if (bVar49 != 0) {
          for (; (bVar49 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
          }
        }
        uVar62 = *(ulong *)(uVar60 + lVar61 * 8);
        uVar51 = bVar49 - 1 & (uint)bVar49;
        if (uVar51 != 0) {
          uVar52 = *(uint *)(local_1180 + lVar61 * 4);
          lVar61 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
            }
          }
          uVar55 = *(ulong *)(uVar60 + lVar61 * 8);
          uVar53 = *(uint *)(local_1180 + lVar61 * 4);
          uVar51 = uVar51 - 1 & uVar51;
          if (uVar51 == 0) {
            if (uVar52 < uVar53) {
              *(ulong *)*pauVar59 = uVar55;
              *(uint *)(*pauVar59 + 8) = uVar53;
              pauVar59 = pauVar59 + 1;
            }
            else {
              *(ulong *)*pauVar59 = uVar62;
              *(uint *)(*pauVar59 + 8) = uVar52;
              pauVar59 = pauVar59 + 1;
              uVar62 = uVar55;
            }
          }
          else {
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar62;
            auVar67 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar52));
            auVar88._8_8_ = 0;
            auVar88._0_8_ = uVar55;
            auVar105 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar53));
            lVar61 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
              }
            }
            auVar104._8_8_ = 0;
            auVar104._0_8_ = *(ulong *)(uVar60 + lVar61 * 8);
            auVar89 = vpunpcklqdq_avx(auVar104,ZEXT416(*(uint *)(local_1180 + lVar61 * 4)));
            auVar74 = vpcmpgtd_avx(auVar105,auVar67);
            uVar51 = uVar51 - 1 & uVar51;
            if (uVar51 == 0) {
              auVar87 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar105,auVar67,auVar87);
              auVar67 = vblendvps_avx(auVar67,auVar105,auVar87);
              auVar105 = vpcmpgtd_avx(auVar89,auVar74);
              auVar87 = vpshufd_avx(auVar105,0xaa);
              auVar105 = vblendvps_avx(auVar89,auVar74,auVar87);
              auVar74 = vblendvps_avx(auVar74,auVar89,auVar87);
              auVar89 = vpcmpgtd_avx(auVar74,auVar67);
              auVar87 = vpshufd_avx(auVar89,0xaa);
              auVar89 = vblendvps_avx(auVar74,auVar67,auVar87);
              auVar67 = vblendvps_avx(auVar67,auVar74,auVar87);
              *pauVar59 = auVar67;
              pauVar59[1] = auVar89;
              uVar62 = auVar105._0_8_;
              pauVar59 = pauVar59 + 2;
            }
            else {
              lVar61 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> lVar61 & 1) == 0; lVar61 = lVar61 + 1) {
                }
              }
              auVar128._8_8_ = 0;
              auVar128._0_8_ = *(ulong *)(uVar60 + lVar61 * 8);
              auVar102 = vpunpcklqdq_avx(auVar128,ZEXT416(*(uint *)(local_1180 + lVar61 * 4)));
              auVar87 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar105,auVar67,auVar87);
              auVar67 = vblendvps_avx(auVar67,auVar105,auVar87);
              auVar105 = vpcmpgtd_avx(auVar102,auVar89);
              auVar87 = vpshufd_avx(auVar105,0xaa);
              auVar105 = vblendvps_avx(auVar102,auVar89,auVar87);
              auVar89 = vblendvps_avx(auVar89,auVar102,auVar87);
              auVar87 = vpcmpgtd_avx(auVar89,auVar67);
              auVar102 = vpshufd_avx(auVar87,0xaa);
              auVar87 = vblendvps_avx(auVar89,auVar67,auVar102);
              auVar67 = vblendvps_avx(auVar67,auVar89,auVar102);
              auVar89 = vpcmpgtd_avx(auVar105,auVar74);
              auVar102 = vpshufd_avx(auVar89,0xaa);
              auVar89 = vblendvps_avx(auVar105,auVar74,auVar102);
              auVar105 = vblendvps_avx(auVar74,auVar105,auVar102);
              auVar74 = vpcmpgtd_avx(auVar87,auVar105);
              auVar102 = vpshufd_avx(auVar74,0xaa);
              auVar74 = vblendvps_avx(auVar87,auVar105,auVar102);
              auVar105 = vblendvps_avx(auVar105,auVar87,auVar102);
              *pauVar59 = auVar67;
              pauVar59[1] = auVar105;
              pauVar59[2] = auVar74;
              uVar62 = auVar89._0_8_;
              pauVar59 = pauVar59 + 3;
            }
          }
        }
      }
      uVar60 = (ulong)((uint)uVar62 & 0xf);
      if (uVar60 != 8) {
        local_1240 = *(undefined4 *)(ray + k * 4);
        uStack_123c = local_1240;
        uStack_1238 = local_1240;
        uStack_1234 = local_1240;
        uStack_1230 = local_1240;
        uStack_122c = local_1240;
        uStack_1228 = local_1240;
        uStack_1224 = local_1240;
        local_1260 = *(undefined4 *)(ray + k * 4 + 0x10);
        uStack_125c = local_1260;
        uStack_1258 = local_1260;
        uStack_1254 = local_1260;
        uStack_1250 = local_1260;
        uStack_124c = local_1260;
        uStack_1248 = local_1260;
        uStack_1244 = local_1260;
        local_1280 = *(undefined4 *)(ray + k * 4 + 0x20);
        uStack_127c = local_1280;
        uStack_1278 = local_1280;
        uStack_1274 = local_1280;
        uStack_1270 = local_1280;
        uStack_126c = local_1280;
        uStack_1268 = local_1280;
        uStack_1264 = local_1280;
        local_12a0 = *(float *)(ray + k * 4 + 0x40);
        fStack_129c = local_12a0;
        fStack_1298 = local_12a0;
        fStack_1294 = local_12a0;
        fStack_1290 = local_12a0;
        fStack_128c = local_12a0;
        fStack_1288 = local_12a0;
        fStack_1284 = local_12a0;
        local_12c0 = *(float *)(ray + k * 4 + 0x50);
        fStack_12bc = local_12c0;
        fStack_12b8 = local_12c0;
        fStack_12b4 = local_12c0;
        fStack_12b0 = local_12c0;
        fStack_12ac = local_12c0;
        fStack_12a8 = local_12c0;
        fStack_12a4 = local_12c0;
        uVar62 = uVar62 & 0xfffffffffffffff0;
        local_12e0 = *(float *)(ray + k * 4 + 0x60);
        fStack_12dc = local_12e0;
        fStack_12d8 = local_12e0;
        fStack_12d4 = local_12e0;
        fStack_12d0 = local_12e0;
        fStack_12cc = local_12e0;
        fStack_12c8 = local_12e0;
        fStack_12c4 = local_12e0;
        lVar61 = 0;
        do {
          lVar54 = lVar61 * 0xe0;
          lVar1 = uVar62 + 0xd0 + lVar54;
          local_11a0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1198 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar62 + 0xc0 + lVar54;
          local_13a0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1398 = *(undefined8 *)(lVar1 + 0x18);
          uStack_1390 = local_13a0;
          uStack_1388 = uStack_1398;
          uStack_1190 = local_11a0;
          uStack_1188 = uStack_1198;
          auVar107._16_16_ = *(undefined1 (*) [16])(uVar62 + 0x60 + lVar54);
          auVar107._0_16_ = *(undefined1 (*) [16])(uVar62 + lVar54);
          auVar68._16_16_ = *(undefined1 (*) [16])(uVar62 + 0x70 + lVar54);
          auVar68._0_16_ = *(undefined1 (*) [16])(uVar62 + 0x10 + lVar54);
          auVar153._16_16_ = *(undefined1 (*) [16])(uVar62 + 0x80 + lVar54);
          auVar153._0_16_ = *(undefined1 (*) [16])(uVar62 + 0x20 + lVar54);
          auVar67 = *(undefined1 (*) [16])(uVar62 + 0x30 + lVar54);
          auVar76._16_16_ = auVar67;
          auVar76._0_16_ = auVar67;
          auVar67 = *(undefined1 (*) [16])(uVar62 + 0x40 + lVar54);
          auVar111._16_16_ = auVar67;
          auVar111._0_16_ = auVar67;
          auVar67 = *(undefined1 (*) [16])(uVar62 + 0x50 + lVar54);
          auVar129._16_16_ = auVar67;
          auVar129._0_16_ = auVar67;
          auVar67 = *(undefined1 (*) [16])(uVar62 + 0x90 + lVar54);
          auVar138._16_16_ = auVar67;
          auVar138._0_16_ = auVar67;
          auVar67 = *(undefined1 (*) [16])(uVar62 + 0xa0 + lVar54);
          auVar146._16_16_ = auVar67;
          auVar146._0_16_ = auVar67;
          lVar54 = uVar62 + 0xb0 + lVar54;
          pauVar40 = (undefined1 (*) [16])(lVar54 + 0x10);
          uStack_1450 = *(undefined8 *)*pauVar40;
          _local_1460 = *pauVar40;
          uStack_1448 = *(undefined8 *)(lVar54 + 0x18);
          auVar75 = vsubps_avx(auVar107,auVar76);
          local_11e0 = vsubps_avx(auVar68,auVar111);
          local_11c0 = vsubps_avx(auVar153,auVar129);
          auVar106 = vsubps_avx(auVar138,auVar107);
          local_1220 = vsubps_avx(auVar146,auVar68);
          local_1200 = vsubps_avx(_local_1460,auVar153);
          fVar86 = local_1200._0_4_;
          fVar109 = local_11e0._0_4_;
          fVar97 = local_1200._4_4_;
          fVar113 = local_11e0._4_4_;
          auVar20._4_4_ = fVar113 * fVar97;
          auVar20._0_4_ = fVar109 * fVar86;
          fVar123 = local_1200._8_4_;
          fVar115 = local_11e0._8_4_;
          auVar20._8_4_ = fVar115 * fVar123;
          fVar8 = local_1200._12_4_;
          fVar117 = local_11e0._12_4_;
          auVar20._12_4_ = fVar117 * fVar8;
          fVar11 = local_1200._16_4_;
          fVar119 = local_11e0._16_4_;
          auVar20._16_4_ = fVar119 * fVar11;
          fVar14 = local_1200._20_4_;
          fVar121 = local_11e0._20_4_;
          auVar20._20_4_ = fVar121 * fVar14;
          fVar17 = local_1200._24_4_;
          fVar124 = local_11e0._24_4_;
          uVar2 = auVar67._12_4_;
          auVar20._24_4_ = fVar124 * fVar17;
          auVar20._28_4_ = uVar2;
          fVar93 = local_1220._0_4_;
          fVar127 = local_11c0._0_4_;
          fVar99 = local_1220._4_4_;
          fVar131 = local_11c0._4_4_;
          auVar21._4_4_ = fVar131 * fVar99;
          auVar21._0_4_ = fVar127 * fVar93;
          fVar126 = local_1220._8_4_;
          fVar132 = local_11c0._8_4_;
          auVar21._8_4_ = fVar132 * fVar126;
          fVar9 = local_1220._12_4_;
          fVar133 = local_11c0._12_4_;
          auVar21._12_4_ = fVar133 * fVar9;
          fVar12 = local_1220._16_4_;
          fVar134 = local_11c0._16_4_;
          auVar21._16_4_ = fVar134 * fVar12;
          fVar15 = local_1220._20_4_;
          fVar135 = local_11c0._20_4_;
          auVar21._20_4_ = fVar135 * fVar15;
          fVar18 = local_1220._24_4_;
          uVar6 = local_11e0._28_4_;
          fVar136 = local_11c0._24_4_;
          auVar21._24_4_ = fVar136 * fVar18;
          auVar21._28_4_ = uVar6;
          local_1100 = vsubps_avx(auVar21,auVar20);
          local_1440 = auVar106._0_4_;
          fStack_143c = auVar106._4_4_;
          fStack_1438 = auVar106._8_4_;
          fStack_1434 = auVar106._12_4_;
          fStack_1430 = auVar106._16_4_;
          fStack_142c = auVar106._20_4_;
          fStack_1428 = auVar106._24_4_;
          auVar22._4_4_ = fVar131 * fStack_143c;
          auVar22._0_4_ = fVar127 * local_1440;
          auVar22._8_4_ = fVar132 * fStack_1438;
          auVar22._12_4_ = fVar133 * fStack_1434;
          auVar22._16_4_ = fVar134 * fStack_1430;
          auVar22._20_4_ = fVar135 * fStack_142c;
          auVar22._24_4_ = fVar136 * fStack_1428;
          auVar22._28_4_ = local_1100._28_4_;
          fVar85 = auVar75._0_4_;
          fVar90 = auVar75._4_4_;
          auVar23._4_4_ = fVar90 * fVar97;
          auVar23._0_4_ = fVar85 * fVar86;
          fVar92 = auVar75._8_4_;
          auVar23._8_4_ = fVar92 * fVar123;
          fVar94 = auVar75._12_4_;
          auVar23._12_4_ = fVar94 * fVar8;
          fVar96 = auVar75._16_4_;
          auVar23._16_4_ = fVar96 * fVar11;
          fVar98 = auVar75._20_4_;
          auVar23._20_4_ = fVar98 * fVar14;
          fVar100 = auVar75._24_4_;
          auVar23._24_4_ = fVar100 * fVar17;
          auVar23._28_4_ = uVar2;
          auVar20 = vsubps_avx(auVar23,auVar22);
          auVar24._4_4_ = fVar90 * fVar99;
          auVar24._0_4_ = fVar85 * fVar93;
          auVar24._8_4_ = fVar92 * fVar126;
          auVar24._12_4_ = fVar94 * fVar9;
          auVar24._16_4_ = fVar96 * fVar12;
          auVar24._20_4_ = fVar98 * fVar15;
          auVar24._24_4_ = fVar100 * fVar18;
          auVar24._28_4_ = auVar20._28_4_;
          auVar25._4_4_ = fVar113 * fStack_143c;
          auVar25._0_4_ = fVar109 * local_1440;
          auVar25._8_4_ = fVar115 * fStack_1438;
          auVar25._12_4_ = fVar117 * fStack_1434;
          auVar25._16_4_ = fVar119 * fStack_1430;
          auVar25._20_4_ = fVar121 * fStack_142c;
          auVar25._24_4_ = fVar124 * fStack_1428;
          auVar25._28_4_ = uVar2;
          auVar21 = vsubps_avx(auVar25,auVar24);
          auVar43._4_4_ = uStack_123c;
          auVar43._0_4_ = local_1240;
          auVar43._8_4_ = uStack_1238;
          auVar43._12_4_ = uStack_1234;
          auVar43._16_4_ = uStack_1230;
          auVar43._20_4_ = uStack_122c;
          auVar43._24_4_ = uStack_1228;
          auVar43._28_4_ = uStack_1224;
          auVar75 = vsubps_avx(auVar107,auVar43);
          auVar42._4_4_ = uStack_125c;
          auVar42._0_4_ = local_1260;
          auVar42._8_4_ = uStack_1258;
          auVar42._12_4_ = uStack_1254;
          auVar42._16_4_ = uStack_1250;
          auVar42._20_4_ = uStack_124c;
          auVar42._24_4_ = uStack_1248;
          auVar42._28_4_ = uStack_1244;
          local_1300 = vsubps_avx(auVar68,auVar42);
          auVar41._4_4_ = uStack_127c;
          auVar41._0_4_ = local_1280;
          auVar41._8_4_ = uStack_1278;
          auVar41._12_4_ = uStack_1274;
          auVar41._16_4_ = uStack_1270;
          auVar41._20_4_ = uStack_126c;
          auVar41._24_4_ = uStack_1268;
          auVar41._28_4_ = uStack_1264;
          local_1320 = vsubps_avx(auVar153,auVar41);
          fVar110 = local_1320._0_4_;
          fVar114 = local_1320._4_4_;
          auVar26._4_4_ = fVar114 * fStack_12bc;
          auVar26._0_4_ = fVar110 * local_12c0;
          fVar116 = local_1320._8_4_;
          auVar26._8_4_ = fVar116 * fStack_12b8;
          fVar118 = local_1320._12_4_;
          auVar26._12_4_ = fVar118 * fStack_12b4;
          fVar120 = local_1320._16_4_;
          auVar26._16_4_ = fVar120 * fStack_12b0;
          fVar122 = local_1320._20_4_;
          auVar26._20_4_ = fVar122 * fStack_12ac;
          fVar125 = local_1320._24_4_;
          auVar26._24_4_ = fVar125 * fStack_12a8;
          auVar26._28_4_ = local_1220._28_4_;
          fVar95 = local_1300._0_4_;
          fVar101 = local_1300._4_4_;
          auVar27._4_4_ = fStack_12dc * fVar101;
          auVar27._0_4_ = local_12e0 * fVar95;
          fVar91 = local_1300._8_4_;
          auVar27._8_4_ = fStack_12d8 * fVar91;
          fVar10 = local_1300._12_4_;
          auVar27._12_4_ = fStack_12d4 * fVar10;
          fVar13 = local_1300._16_4_;
          auVar27._16_4_ = fStack_12d0 * fVar13;
          fVar16 = local_1300._20_4_;
          auVar27._20_4_ = fStack_12cc * fVar16;
          fVar19 = local_1300._24_4_;
          auVar27._24_4_ = fStack_12c8 * fVar19;
          auVar27._28_4_ = uVar6;
          auVar106 = vsubps_avx(auVar27,auVar26);
          fVar145 = auVar75._0_4_;
          fVar147 = auVar75._4_4_;
          auVar28._4_4_ = fVar147 * fStack_12dc;
          auVar28._0_4_ = fVar145 * local_12e0;
          fVar148 = auVar75._8_4_;
          auVar28._8_4_ = fVar148 * fStack_12d8;
          fVar149 = auVar75._12_4_;
          auVar28._12_4_ = fVar149 * fStack_12d4;
          fVar150 = auVar75._16_4_;
          auVar28._16_4_ = fVar150 * fStack_12d0;
          fVar151 = auVar75._20_4_;
          auVar28._20_4_ = fVar151 * fStack_12cc;
          fVar152 = auVar75._24_4_;
          auVar28._24_4_ = fVar152 * fStack_12c8;
          auVar28._28_4_ = uVar6;
          auVar30._4_4_ = fVar114 * fStack_129c;
          auVar30._0_4_ = fVar110 * local_12a0;
          auVar30._8_4_ = fVar116 * fStack_1298;
          auVar30._12_4_ = fVar118 * fStack_1294;
          auVar30._16_4_ = fVar120 * fStack_1290;
          auVar30._20_4_ = fVar122 * fStack_128c;
          fVar29 = local_1320._28_4_;
          auVar30._24_4_ = fVar125 * fStack_1288;
          auVar30._28_4_ = fVar29;
          auVar22 = vsubps_avx(auVar30,auVar28);
          auVar31._4_4_ = fStack_129c * fVar101;
          auVar31._0_4_ = local_12a0 * fVar95;
          auVar31._8_4_ = fStack_1298 * fVar91;
          auVar31._12_4_ = fStack_1294 * fVar10;
          auVar31._16_4_ = fStack_1290 * fVar13;
          auVar31._20_4_ = fStack_128c * fVar16;
          auVar31._24_4_ = fStack_1288 * fVar19;
          auVar31._28_4_ = fVar29;
          auVar33._4_4_ = fVar147 * fStack_12bc;
          auVar33._0_4_ = fVar145 * local_12c0;
          auVar33._8_4_ = fVar148 * fStack_12b8;
          auVar33._12_4_ = fVar149 * fStack_12b4;
          auVar33._16_4_ = fVar150 * fStack_12b0;
          auVar33._20_4_ = fVar151 * fStack_12ac;
          fVar32 = auVar75._28_4_;
          auVar33._24_4_ = fVar152 * fStack_12a8;
          auVar33._28_4_ = fVar32;
          auVar23 = vsubps_avx(auVar33,auVar31);
          fVar137 = auVar21._0_4_;
          fVar139 = auVar21._4_4_;
          fVar140 = auVar21._8_4_;
          fVar141 = auVar21._12_4_;
          fVar142 = auVar21._16_4_;
          fVar143 = auVar21._20_4_;
          fVar144 = auVar21._24_4_;
          local_1460._0_4_ = auVar20._0_4_;
          uVar2 = local_1460._0_4_;
          local_1460._4_4_ = auVar20._4_4_;
          uVar6 = local_1460._4_4_;
          uStack_1458._0_4_ = auVar20._8_4_;
          fVar44 = (float)uStack_1458;
          uStack_1458._4_4_ = auVar20._12_4_;
          fVar45 = uStack_1458._4_4_;
          uStack_1450._0_4_ = auVar20._16_4_;
          fVar46 = (float)uStack_1450;
          uStack_1450._4_4_ = auVar20._20_4_;
          fVar47 = uStack_1450._4_4_;
          uStack_1448._0_4_ = auVar20._24_4_;
          fVar48 = (float)uStack_1448;
          local_13e0 = local_1100._0_4_;
          fStack_13dc = local_1100._4_4_;
          fStack_13d8 = local_1100._8_4_;
          fStack_13d4 = local_1100._12_4_;
          fStack_13d0 = local_1100._16_4_;
          fStack_13cc = local_1100._20_4_;
          fStack_13c8 = local_1100._24_4_;
          auVar69._0_4_ =
               local_12a0 * local_13e0 + fVar137 * local_12e0 + local_12c0 * (float)local_1460._0_4_
          ;
          auVar69._4_4_ =
               fStack_129c * fStack_13dc +
               fVar139 * fStack_12dc + fStack_12bc * (float)local_1460._4_4_;
          auVar69._8_4_ =
               fStack_1298 * fStack_13d8 + fVar140 * fStack_12d8 + fStack_12b8 * (float)uStack_1458;
          auVar69._12_4_ =
               fStack_1294 * fStack_13d4 + fVar141 * fStack_12d4 + fStack_12b4 * uStack_1458._4_4_;
          auVar69._16_4_ =
               fStack_1290 * fStack_13d0 + fVar142 * fStack_12d0 + fStack_12b0 * (float)uStack_1450;
          auVar69._20_4_ =
               fStack_128c * fStack_13cc + fVar143 * fStack_12cc + fStack_12ac * uStack_1450._4_4_;
          auVar69._24_4_ =
               fStack_1288 * fStack_13c8 + fVar144 * fStack_12c8 + fStack_12a8 * (float)uStack_1448;
          auVar69._28_4_ = fVar32 + fVar32 + local_1300._28_4_;
          auVar77._8_4_ = 0x80000000;
          auVar77._0_8_ = 0x8000000080000000;
          auVar77._12_4_ = 0x80000000;
          auVar77._16_4_ = 0x80000000;
          auVar77._20_4_ = 0x80000000;
          auVar77._24_4_ = 0x80000000;
          auVar77._28_4_ = 0x80000000;
          auVar75 = vandps_avx(auVar77,auVar69);
          uVar51 = auVar75._0_4_;
          auVar130._0_4_ =
               (float)(uVar51 ^ (uint)(auVar106._0_4_ * local_1440 +
                                      auVar23._0_4_ * fVar86 + auVar22._0_4_ * fVar93));
          uVar52 = auVar75._4_4_;
          auVar130._4_4_ =
               (float)(uVar52 ^ (uint)(auVar106._4_4_ * fStack_143c +
                                      auVar23._4_4_ * fVar97 + auVar22._4_4_ * fVar99));
          uVar53 = auVar75._8_4_;
          auVar130._8_4_ =
               (float)(uVar53 ^ (uint)(auVar106._8_4_ * fStack_1438 +
                                      auVar23._8_4_ * fVar123 + auVar22._8_4_ * fVar126));
          uVar80 = auVar75._12_4_;
          auVar130._12_4_ =
               (float)(uVar80 ^ (uint)(auVar106._12_4_ * fStack_1434 +
                                      auVar23._12_4_ * fVar8 + auVar22._12_4_ * fVar9));
          uVar81 = auVar75._16_4_;
          auVar130._16_4_ =
               (float)(uVar81 ^ (uint)(auVar106._16_4_ * fStack_1430 +
                                      auVar23._16_4_ * fVar11 + auVar22._16_4_ * fVar12));
          uVar82 = auVar75._20_4_;
          auVar130._20_4_ =
               (float)(uVar82 ^ (uint)(auVar106._20_4_ * fStack_142c +
                                      auVar23._20_4_ * fVar14 + auVar22._20_4_ * fVar15));
          uVar83 = auVar75._24_4_;
          auVar130._24_4_ =
               (float)(uVar83 ^ (uint)(auVar106._24_4_ * fStack_1428 +
                                      auVar23._24_4_ * fVar17 + auVar22._24_4_ * fVar18));
          uVar84 = auVar75._28_4_;
          auVar130._28_4_ = (float)(uVar84 ^ (uint)(fStack_1284 + fVar32 + auVar21._28_4_));
          local_1160._0_4_ =
               (float)(uVar51 ^ (uint)(auVar106._0_4_ * fVar85 +
                                      auVar23._0_4_ * fVar127 + auVar22._0_4_ * fVar109));
          local_1160._4_4_ =
               (float)(uVar52 ^ (uint)(auVar106._4_4_ * fVar90 +
                                      auVar23._4_4_ * fVar131 + auVar22._4_4_ * fVar113));
          local_1160._8_4_ =
               (float)(uVar53 ^ (uint)(auVar106._8_4_ * fVar92 +
                                      auVar23._8_4_ * fVar132 + auVar22._8_4_ * fVar115));
          local_1160._12_4_ =
               (float)(uVar80 ^ (uint)(auVar106._12_4_ * fVar94 +
                                      auVar23._12_4_ * fVar133 + auVar22._12_4_ * fVar117));
          local_1160._16_4_ =
               (float)(uVar81 ^ (uint)(auVar106._16_4_ * fVar96 +
                                      auVar23._16_4_ * fVar134 + auVar22._16_4_ * fVar119));
          local_1160._20_4_ =
               (float)(uVar82 ^ (uint)(auVar106._20_4_ * fVar98 +
                                      auVar23._20_4_ * fVar135 + auVar22._20_4_ * fVar121));
          local_1160._24_4_ =
               (float)(uVar83 ^ (uint)(auVar106._24_4_ * fVar100 +
                                      auVar23._24_4_ * fVar136 + auVar22._24_4_ * fVar124));
          local_1160._28_4_ = (float)(uVar84 ^ (uint)(fStack_12c4 + fStack_1284 + auVar22._28_4_));
          auVar106 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar75 = vcmpps_avx(auVar130,auVar106,5);
          auVar106 = vcmpps_avx(local_1160,auVar106,5);
          auVar75 = vandps_avx(auVar75,auVar106);
          auVar108._8_4_ = 0x7fffffff;
          auVar108._0_8_ = 0x7fffffff7fffffff;
          auVar108._12_4_ = 0x7fffffff;
          auVar108._16_4_ = 0x7fffffff;
          auVar108._20_4_ = 0x7fffffff;
          auVar108._24_4_ = 0x7fffffff;
          auVar108._28_4_ = 0x7fffffff;
          local_1120 = vandps_avx(auVar108,auVar69);
          auVar106 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar69,4);
          auVar75 = vandps_avx(auVar75,auVar106);
          auVar70._0_4_ = auVar130._0_4_ + local_1160._0_4_;
          auVar70._4_4_ = auVar130._4_4_ + local_1160._4_4_;
          auVar70._8_4_ = auVar130._8_4_ + local_1160._8_4_;
          auVar70._12_4_ = auVar130._12_4_ + local_1160._12_4_;
          auVar70._16_4_ = auVar130._16_4_ + local_1160._16_4_;
          auVar70._20_4_ = auVar130._20_4_ + local_1160._20_4_;
          auVar70._24_4_ = auVar130._24_4_ + local_1160._24_4_;
          auVar70._28_4_ = auVar130._28_4_ + local_1160._28_4_;
          auVar106 = vcmpps_avx(auVar70,local_1120,2);
          auVar22 = auVar106 & auVar75;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0x7f,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar22 >> 0xbf,0) != '\0') ||
              (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar22[0x1f] < '\0') {
            auVar75 = vandps_avx(auVar75,auVar106);
            auVar67 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
            local_1140._0_4_ =
                 (float)(uVar51 ^ (uint)(fVar145 * local_13e0 +
                                        fVar95 * (float)local_1460._0_4_ + fVar110 * fVar137));
            local_1140._4_4_ =
                 (float)(uVar52 ^ (uint)(fVar147 * fStack_13dc +
                                        fVar101 * (float)local_1460._4_4_ + fVar114 * fVar139));
            local_1140._8_4_ =
                 (float)(uVar53 ^ (uint)(fVar148 * fStack_13d8 +
                                        fVar91 * (float)uStack_1458 + fVar116 * fVar140));
            local_1140._12_4_ =
                 (float)(uVar80 ^ (uint)(fVar149 * fStack_13d4 +
                                        fVar10 * uStack_1458._4_4_ + fVar118 * fVar141));
            local_1140._16_4_ =
                 (float)(uVar81 ^ (uint)(fVar150 * fStack_13d0 +
                                        fVar13 * (float)uStack_1450 + fVar120 * fVar142));
            local_1140._20_4_ =
                 (float)(uVar82 ^ (uint)(fVar151 * fStack_13cc +
                                        fVar16 * uStack_1450._4_4_ + fVar122 * fVar143));
            local_1140._24_4_ =
                 (float)(uVar83 ^ (uint)(fVar152 * fStack_13c8 +
                                        fVar19 * (float)uStack_1448 + fVar125 * fVar144));
            local_1140._28_4_ = uVar84 ^ (uint)(fVar32 + local_1300._28_4_ + fVar29);
            fVar86 = *(float *)(ray + k * 4 + 0x30);
            fVar93 = local_1120._0_4_;
            fVar95 = local_1120._4_4_;
            auVar34._4_4_ = fVar95 * fVar86;
            auVar34._0_4_ = fVar93 * fVar86;
            fVar97 = local_1120._8_4_;
            auVar34._8_4_ = fVar97 * fVar86;
            fVar99 = local_1120._12_4_;
            auVar34._12_4_ = fVar99 * fVar86;
            fVar101 = local_1120._16_4_;
            auVar34._16_4_ = fVar101 * fVar86;
            fVar123 = local_1120._20_4_;
            auVar34._20_4_ = fVar123 * fVar86;
            fVar126 = local_1120._24_4_;
            auVar34._24_4_ = fVar126 * fVar86;
            auVar34._28_4_ = fVar86;
            auVar75 = vcmpps_avx(auVar34,local_1140,1);
            fVar86 = *(float *)(ray + k * 4 + 0x80);
            auVar35._4_4_ = fVar95 * fVar86;
            auVar35._0_4_ = fVar93 * fVar86;
            auVar35._8_4_ = fVar97 * fVar86;
            auVar35._12_4_ = fVar99 * fVar86;
            auVar35._16_4_ = fVar101 * fVar86;
            auVar35._20_4_ = fVar123 * fVar86;
            auVar35._24_4_ = fVar126 * fVar86;
            auVar35._28_4_ = fVar86;
            auVar106 = vcmpps_avx(local_1140,auVar35,2);
            auVar75 = vandps_avx(auVar75,auVar106);
            auVar105 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
            auVar67 = vpand_avx(auVar105,auVar67);
            auVar105 = vpmovzxwd_avx(auVar67);
            auVar74 = vpslld_avx(auVar105,0x1f);
            auVar89 = vpsrad_avx(auVar74,0x1f);
            auVar105 = vpunpckhwd_avx(auVar67,auVar67);
            auVar105 = vpslld_avx(auVar105,0x1f);
            auVar105 = vpsrad_avx(auVar105,0x1f);
            local_10a0._16_16_ = auVar105;
            local_10a0._0_16_ = auVar89;
            if ((((((((local_10a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_10a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_10a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_10a0 >> 0x7f,0) != '\0') ||
                  (local_10a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar105 >> 0x3f,0) != '\0') ||
                (local_10a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar105[0xf] < '\0') {
              local_1180 = auVar130;
              local_1460 = auVar20._0_8_;
              uStack_1458 = auVar20._8_8_;
              uStack_1450 = auVar20._16_8_;
              uStack_1448 = auVar20._24_8_;
              local_10e0 = local_1460;
              uStack_10d8 = uStack_1458;
              uStack_10d0 = uStack_1450;
              uStack_10c8 = uStack_1448;
              local_1400 = auVar21._0_8_;
              uStack_13f8 = auVar21._8_8_;
              uStack_13f0 = auVar21._16_8_;
              uStack_13e8 = auVar21._24_8_;
              local_10c0 = local_1400;
              uStack_10b8 = uStack_13f8;
              uStack_10b0 = uStack_13f0;
              uStack_10a8 = uStack_13e8;
              local_fc0 = local_1340;
              auVar106 = vrcpps_avx(local_1120);
              local_1380 = local_10a0;
              fVar86 = auVar106._0_4_;
              fVar91 = auVar106._4_4_;
              auVar36._4_4_ = fVar95 * fVar91;
              auVar36._0_4_ = fVar93 * fVar86;
              fVar93 = auVar106._8_4_;
              auVar36._8_4_ = fVar97 * fVar93;
              fVar95 = auVar106._12_4_;
              auVar36._12_4_ = fVar99 * fVar95;
              fVar97 = auVar106._16_4_;
              auVar36._16_4_ = fVar101 * fVar97;
              fVar99 = auVar106._20_4_;
              auVar36._20_4_ = fVar123 * fVar99;
              fVar101 = auVar106._24_4_;
              auVar36._24_4_ = fVar126 * fVar101;
              auVar36._28_4_ = auVar105._12_4_;
              auVar112._8_4_ = 0x3f800000;
              auVar112._0_8_ = 0x3f8000003f800000;
              auVar112._12_4_ = 0x3f800000;
              auVar112._16_4_ = 0x3f800000;
              auVar112._20_4_ = 0x3f800000;
              auVar112._24_4_ = 0x3f800000;
              auVar112._28_4_ = 0x3f800000;
              auVar20 = vsubps_avx(auVar112,auVar36);
              fVar86 = fVar86 + fVar86 * auVar20._0_4_;
              fVar91 = fVar91 + fVar91 * auVar20._4_4_;
              fVar93 = fVar93 + fVar93 * auVar20._8_4_;
              fVar95 = fVar95 + fVar95 * auVar20._12_4_;
              fVar97 = fVar97 + fVar97 * auVar20._16_4_;
              fVar99 = fVar99 + fVar99 * auVar20._20_4_;
              fVar101 = fVar101 + fVar101 * auVar20._24_4_;
              auVar37._4_4_ = fVar91 * local_1140._4_4_;
              auVar37._0_4_ = fVar86 * local_1140._0_4_;
              auVar37._8_4_ = fVar93 * local_1140._8_4_;
              auVar37._12_4_ = fVar95 * local_1140._12_4_;
              auVar37._16_4_ = fVar97 * local_1140._16_4_;
              auVar37._20_4_ = fVar99 * local_1140._20_4_;
              auVar37._24_4_ = fVar101 * local_1140._24_4_;
              auVar37._28_4_ = auVar20._28_4_;
              local_1040 = auVar37;
              auVar38._4_4_ = fVar91 * auVar130._4_4_;
              auVar38._0_4_ = fVar86 * auVar130._0_4_;
              auVar38._8_4_ = fVar93 * auVar130._8_4_;
              auVar38._12_4_ = fVar95 * auVar130._12_4_;
              auVar38._16_4_ = fVar97 * auVar130._16_4_;
              auVar38._20_4_ = fVar99 * auVar130._20_4_;
              auVar38._24_4_ = fVar101 * auVar130._24_4_;
              auVar38._28_4_ = local_1140._28_4_;
              auVar75 = vminps_avx(auVar38,auVar112);
              auVar39._4_4_ = fVar91 * local_1160._4_4_;
              auVar39._0_4_ = fVar86 * local_1160._0_4_;
              auVar39._8_4_ = fVar93 * local_1160._8_4_;
              auVar39._12_4_ = fVar95 * local_1160._12_4_;
              auVar39._16_4_ = fVar97 * local_1160._16_4_;
              auVar39._20_4_ = fVar99 * local_1160._20_4_;
              auVar39._24_4_ = fVar101 * local_1160._24_4_;
              auVar39._28_4_ = auVar106._28_4_ + auVar20._28_4_;
              auVar106 = vminps_avx(auVar39,auVar112);
              auVar20 = vsubps_avx(auVar112,auVar75);
              auVar21 = vsubps_avx(auVar112,auVar106);
              local_1060 = vblendvps_avx(auVar106,auVar20,local_1340);
              local_1080 = vblendvps_avx(auVar75,auVar21,local_1340);
              local_1020[0] = local_13e0 * (float)local_1360._0_4_;
              local_1020[1] = fStack_13dc * (float)local_1360._4_4_;
              local_1020[2] = fStack_13d8 * fStack_1358;
              local_1020[3] = fStack_13d4 * fStack_1354;
              fStack_1010 = fStack_13d0 * fStack_1350;
              fStack_100c = fStack_13cc * fStack_134c;
              fStack_1008 = fStack_13c8 * fStack_1348;
              uStack_1004 = local_1080._28_4_;
              local_1000[0] = (float)local_1360._0_4_ * (float)uVar2;
              local_1000[1] = (float)local_1360._4_4_ * (float)uVar6;
              local_1000[2] = fStack_1358 * fVar44;
              local_1000[3] = fStack_1354 * fVar45;
              fStack_ff0 = fStack_1350 * fVar46;
              fStack_fec = fStack_134c * fVar47;
              fStack_fe8 = fStack_1348 * fVar48;
              uStack_fe4 = local_1060._28_4_;
              local_fe0[0] = (float)local_1360._0_4_ * fVar137;
              local_fe0[1] = (float)local_1360._4_4_ * fVar139;
              local_fe0[2] = fStack_1358 * fVar140;
              local_fe0[3] = fStack_1354 * fVar141;
              fStack_fd0 = fStack_1350 * fVar142;
              fStack_fcc = fStack_134c * fVar143;
              fStack_fc8 = fStack_1348 * fVar144;
              uStack_fc4 = uStack_1344;
              auVar105 = vpunpckhwd_avx(auVar67,auVar67);
              auVar105 = vpslld_avx(auVar105,0x1f);
              auVar71._16_16_ = auVar105;
              auVar71._0_16_ = auVar74;
              auVar78._8_4_ = 0x7f800000;
              auVar78._0_8_ = 0x7f8000007f800000;
              auVar78._12_4_ = 0x7f800000;
              auVar78._16_4_ = 0x7f800000;
              auVar78._20_4_ = 0x7f800000;
              auVar78._24_4_ = 0x7f800000;
              auVar78._28_4_ = 0x7f800000;
              auVar75 = vblendvps_avx(auVar78,auVar37,auVar71);
              auVar106 = vshufps_avx(auVar75,auVar75,0xb1);
              auVar106 = vminps_avx(auVar75,auVar106);
              auVar20 = vshufpd_avx(auVar106,auVar106,5);
              auVar106 = vminps_avx(auVar106,auVar20);
              auVar20 = vperm2f128_avx(auVar106,auVar106,1);
              auVar106 = vminps_avx(auVar106,auVar20);
              auVar75 = vcmpps_avx(auVar106,auVar75,0);
              auVar105 = vpackssdw_avx(auVar75._0_16_,auVar75._16_16_);
              auVar67 = vpand_avx(auVar67,auVar105);
              auVar105 = vpmovzxwd_avx(auVar67);
              auVar105 = vpslld_avx(auVar105,0x1f);
              auVar105 = vpsrad_avx(auVar105,0x1f);
              auVar67 = vpunpckhwd_avx(auVar67,auVar67);
              auVar67 = vpslld_avx(auVar67,0x1f);
              auVar67 = vpsrad_avx(auVar67,0x1f);
              auVar72._16_16_ = auVar67;
              auVar72._0_16_ = auVar105;
              if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar72 >> 0x7f,0) == '\0') &&
                    (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar67 >> 0x3f,0) == '\0') &&
                  (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar67[0xf]) {
                auVar72 = local_10a0;
              }
              uVar52 = vmovmskps_avx(auVar72);
              uVar51 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
              pRVar7 = (context->scene->geometries).items;
              uVar52 = *(uint *)(ray + k * 4 + 0x90);
              uVar55 = (ulong)uVar51;
              uVar51 = *(uint *)((long)&local_13a0 + uVar55 * 4);
              uVar53 = (pRVar7[uVar51].ptr)->mask;
              while ((uVar53 & uVar52) == 0) {
                *(undefined4 *)(local_1380 + uVar55 * 4) = 0;
                if ((((((((local_1380 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1380 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1380 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1380 >> 0x7f,0) == '\0') &&
                      (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_1380 >> 0xbf,0) == '\0') &&
                    (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_1380[0x1f]) goto LAB_0032b262;
                auVar79._8_4_ = 0x7f800000;
                auVar79._0_8_ = 0x7f8000007f800000;
                auVar79._12_4_ = 0x7f800000;
                auVar79._16_4_ = 0x7f800000;
                auVar79._20_4_ = 0x7f800000;
                auVar79._24_4_ = 0x7f800000;
                auVar79._28_4_ = 0x7f800000;
                auVar75 = vblendvps_avx(auVar79,auVar37,local_1380);
                auVar106 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar106 = vminps_avx(auVar75,auVar106);
                auVar20 = vshufpd_avx(auVar106,auVar106,5);
                auVar106 = vminps_avx(auVar106,auVar20);
                auVar20 = vperm2f128_avx(auVar106,auVar106,1);
                auVar106 = vminps_avx(auVar106,auVar20);
                auVar106 = vcmpps_avx(auVar75,auVar106,0);
                auVar20 = local_1380 & auVar106;
                auVar75 = local_1380;
                if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar20 >> 0x7f,0) != '\0') ||
                      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0xbf,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar20[0x1f] < '\0') {
                  auVar75 = vandps_avx(auVar106,local_1380);
                }
                uVar53 = vmovmskps_avx(auVar75);
                uVar51 = 0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                  }
                }
                uVar55 = (ulong)uVar51;
                uVar51 = *(uint *)((long)&local_13a0 + uVar55 * 4);
                uVar53 = (pRVar7[uVar51].ptr)->mask;
              }
              uVar2 = *(undefined4 *)(local_1080 + uVar55 * 4);
              uVar6 = *(undefined4 *)(local_1060 + uVar55 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1040 + uVar55 * 4);
              *(float *)(ray + k * 4 + 0xc0) = local_1020[uVar55];
              *(float *)(ray + k * 4 + 0xd0) = local_1000[uVar55];
              *(float *)(ray + k * 4 + 0xe0) = local_fe0[uVar55];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11a0 + uVar55 * 4)
              ;
              *(uint *)(ray + k * 4 + 0x120) = uVar51;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_0032b262:
          lVar61 = lVar61 + 1;
        } while (lVar61 != uVar60 - 8);
      }
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar73 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
    }
    if (pauVar59 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }